

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O1

void __thiscall pg::RTLSolver::run(RTLSolver *this)

{
  bitset *this_00;
  Game *pGVar1;
  uint64_t *puVar2;
  size_t sVar3;
  pointer ppiVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  pointer piVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  size_t sVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int *piVar14;
  ulong uVar15;
  uint *puVar16;
  uint *puVar17;
  ostream *poVar18;
  Error *this_01;
  size_t sVar19;
  long lVar20;
  int **x;
  pointer ppiVar21;
  pointer *ppiVar22;
  
  pGVar1 = (this->super_Solver).game;
  uVar15 = pGVar1->n_vertices;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar15;
  uVar11 = SUB168(auVar8 * ZEXT816(0x18),0);
  uVar12 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
    uVar11 = uVar12;
  }
  puVar13 = (ulong *)operator_new__(uVar11);
  *puVar13 = uVar15;
  if (uVar15 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar13 + 1),0,
           ((uVar15 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar13 + 1);
  piVar14 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  this->str = piVar14;
  bitset::resize(&this->V,pGVar1->n_vertices);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->Z,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  uVar15 = (this->G)._bitssize;
  if (uVar15 != 0) {
    puVar2 = this_00->_bits;
    uVar11 = 0;
    do {
      puVar2[uVar11] = ~puVar2[uVar11];
      uVar11 = uVar11 + 1;
      uVar15 = (this->G)._bitssize;
    } while (uVar11 < uVar15);
  }
  uVar11 = (this->G)._size & 0x3f;
  if (uVar11 != 0) {
    this_00->_bits[uVar15 - 1] = this_00->_bits[uVar15 - 1] & ~(-1L << uVar11);
  }
  puVar16 = (this->Q).queue;
  uVar15 = ((this->super_Solver).game)->n_vertices;
  (this->Q).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->Q).queue = puVar16;
  puVar16 = (this->tangleto).queue;
  uVar15 = ((this->super_Solver).game)->n_vertices;
  (this->tangleto).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar16;
  bitset::resize(&this->escapes,((this->super_Solver).game)->n_vertices);
  puVar16 = (this->pea_state).queue;
  uVar15 = ((this->super_Solver).game)->n_vertices;
  (this->pea_state).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar15 & 0x7fffffff) << 3);
  (this->pea_state).queue = puVar16;
  puVar16 = (this->pea_S).queue;
  uVar15 = ((this->super_Solver).game)->n_vertices;
  (this->pea_S).pointer = 0;
  if (puVar16 != (uint *)0x0) {
    operator_delete__(puVar16);
  }
  puVar16 = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar16;
  pGVar1 = (this->super_Solver).game;
  uVar15 = pGVar1->n_vertices;
  uVar11 = 0xffffffffffffffff;
  if (uVar15 < 0x4000000000000000) {
    uVar11 = uVar15 * 4;
  }
  puVar17 = (uint *)operator_new__(uVar11);
  this->pea_vidx = puVar17;
  bitset::resize(&this->pea_root,pGVar1->n_vertices);
  if (this->onesided == false) {
    do {
      sVar3 = (this->G)._bitssize;
      sVar9 = 0;
      do {
        sVar19 = sVar9;
        if (sVar3 == sVar19) goto LAB_001784e5;
        sVar9 = sVar19 + 1;
      } while ((this->G)._bits[sVar19] == 0);
      if (sVar3 == sVar19) break;
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar10 = rtl(this,this_00,-1,0);
    } while (bVar10);
  }
  else {
    do {
      sVar3 = (this->G)._bitssize;
      sVar9 = 0;
      do {
        sVar19 = sVar9;
        if (sVar3 == sVar19) goto LAB_0017837e;
        sVar9 = sVar19 + 1;
      } while ((this->G)._bits[sVar19] == 0);
      if (sVar3 == sVar19) break;
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;38;5;196miteration\x1b[m even-\x1b[1;36m",0x26);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar10 = rtl(this,this_00,0,0);
    } while (bVar10);
LAB_0017837e:
    do {
      sVar3 = (this->G)._bitssize;
      sVar9 = 0;
      do {
        sVar19 = sVar9;
        if (sVar3 == sVar19) goto LAB_001784e5;
        sVar9 = sVar19 + 1;
      } while ((this->G)._bits[sVar19] == 0);
      if (sVar3 == sVar19) break;
      if ((this->super_Solver).trace != 0) {
        poVar18 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\x1b[1;38;5;196miteration\x1b[m odd-\x1b[1;36m",0x25);
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar10 = rtl(this,this_00,1,0);
    } while (bVar10);
  }
LAB_001784e5:
  poVar18 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"found ",6);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->dominions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," dominions and ",0xf);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->tangles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," tangles.",9);
  std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  poVar18 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"solved in ",10);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," iterations.",0xc);
  std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  uVar15 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar15) {
    uVar11 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        this_01 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_01,"search was incomplete!",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                     ,0x287);
        __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
      }
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  ppiVar4 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar21 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar21 != ppiVar4; ppiVar21 = ppiVar21 + 1) {
    if (*ppiVar21 != (int *)0x0) {
      operator_delete__(*ppiVar21);
    }
  }
  ppiVar4 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar21 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar21 != ppiVar4; ppiVar21 = ppiVar21 + 1) {
    if (*ppiVar21 != (int *)0x0) {
      operator_delete__(*ppiVar21);
    }
  }
  pvVar5 = this->tin;
  if (pvVar5 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar6 = pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar22 = &pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar6 != (pointer)0x0) {
      lVar20 = (long)piVar6 * 0x18;
      do {
        pvVar7 = *(void **)((long)&pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar20);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,*(long *)((long)ppiVar22 + lVar20) - (long)pvVar7);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
    }
    operator_delete__(ppiVar22,(long)piVar6 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx == (uint *)0x0) {
    return;
  }
  operator_delete__(this->pea_vidx);
  return;
}

Assistant:

void
RTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    V.resize(nodecount());
    W.resize(nodecount());
    R.resize(nodecount());
    Z.resize(nodecount());
    S.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());

    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_state.resize(nodecount()*2);
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    if (onesided) {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m even-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 0, 0)) break;
        }
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m odd-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 1, 0)) break;
        }
    } else {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, -1, 0)) break;
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles." << std::endl;
    logger << "solved in " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}